

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

err_t MATROSKA_LinkBlockWithWriteTracks(matroska_block *Block,ebml_master *Tracks,int ForProfile)

{
  ebml_master *peVar1;
  ebml_context *peVar2;
  bool_t bVar3;
  ebml_integer *peVar4;
  ulong uVar5;
  err_t eVar6;
  bool_t WasLinked;
  ebml_integer *TrackNum;
  ebml_master *Track;
  ebml_master *peStack_20;
  int ForProfile_local;
  ebml_master *Tracks_local;
  matroska_block *Block_local;
  
  peVar1 = Block->WriteTrack;
  Track._4_4_ = ForProfile;
  peStack_20 = Tracks;
  Tracks_local = (ebml_master *)Block;
  peVar2 = MATROSKA_getContextTracks();
  bVar3 = EBML_ElementIsType(&Tracks->Base,peVar2);
  if (bVar3 == 0) {
    __assert_fail("EBML_ElementIsType((ebml_element*)Tracks, MATROSKA_getContextTracks())",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x153,
                  "err_t MATROSKA_LinkBlockWithWriteTracks(matroska_block *, ebml_master *, int)");
  }
  bVar3 = Node_IsPartOf(Tracks_local,0x4c424b4d);
  if (bVar3 == 0) {
    __assert_fail("Node_IsPartOf(Block,MATROSKA_BLOCK_CLASS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x154,
                  "err_t MATROSKA_LinkBlockWithWriteTracks(matroska_block *, ebml_master *, int)");
  }
  TrackNum = (ebml_integer *)(peStack_20->Base).Base.Children;
  while( true ) {
    peVar4 = TrackNum;
    if (TrackNum == (ebml_integer *)0x0) {
      return -3;
    }
    peVar2 = MATROSKA_getContextTrackNumber();
    peVar4 = (ebml_integer *)EBML_MasterFindFirstElt((ebml_master *)peVar4,peVar2,0,0,0);
    if (((peVar4 != (ebml_integer *)0x0) && ((peVar4->Base).bValueIsSet != '\0')) &&
       (uVar5 = EBML_IntegerValue(peVar4),
       uVar5 == *(ushort *)((long)&Tracks_local[2].Base.Base.Next + 2))) break;
    if (TrackNum == (ebml_integer *)(TrackNum->Base).Base.Next) {
      __assert_fail("(nodetree*)(Track) != ((nodetree*)(Track))->Next",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x155,
                    "err_t MATROSKA_LinkBlockWithWriteTracks(matroska_block *, ebml_master *, int)")
      ;
    }
    TrackNum = (ebml_integer *)(TrackNum->Base).Base.Next;
  }
  if (Tracks_local == (ebml_master *)0x0) {
    __assert_fail("(const void*)(Block)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x15a,
                  "err_t MATROSKA_LinkBlockWithWriteTracks(matroska_block *, ebml_master *, int)");
  }
  (**(code **)((long)(Tracks_local->Base).Base.Base.VMT + 0x20))(Tracks_local,0x182,&TrackNum,8);
  if (peVar1 != (ebml_master *)0x0) {
    return 0;
  }
  eVar6 = CheckCompression((matroska_block *)Tracks_local,Track._4_4_);
  return eVar6;
}

Assistant:

err_t MATROSKA_LinkBlockWithWriteTracks(matroska_block *Block, ebml_master *Tracks, int ForProfile)
{
    ebml_master *Track;
    ebml_integer *TrackNum;
    bool_t WasLinked = Block->WriteTrack!=NULL;

    assert(EBML_ElementIsType((ebml_element*)Tracks, MATROSKA_getContextTracks()));
    assert(Node_IsPartOf(Block,MATROSKA_BLOCK_CLASS));
    for (Track=(ebml_master*)EBML_MasterChildren(Tracks);Track;Track=(ebml_master*)EBML_MasterNext(Track))
    {
        TrackNum = (ebml_integer*)EBML_MasterFindChild(Track,MATROSKA_getContextTrackNumber());
        if (TrackNum && ((ebml_element*)TrackNum)->bValueIsSet && EBML_IntegerValue(TrackNum)==Block->TrackNumber)
        {
            Node_SET(Block,MATROSKA_BLOCK_WRITE_TRACK,&Track);
            if (WasLinked)
                return ERR_NONE;
            return CheckCompression(Block, ForProfile);
        }
    }
    return ERR_INVALID_DATA;
}